

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall
CVmConsole::log_event(CVmConsole *this,int evt,char *param,size_t paramlen,int param_is_utf8)

{
  int in_ESI;
  size_t in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  undefined4 in_stack_00000010;
  
  evt_to_tag(in_ESI);
  log_event((CVmConsole *)CONCAT44(param_is_utf8,in_stack_00000010),in_stack_00000008,unaff_retaddr,
            in_RDI,in_ESI);
  return in_ESI;
}

Assistant:

int CVmConsole::log_event(VMG_ int evt,
                          const char *param, size_t paramlen,
                          int param_is_utf8)
{
    /* translate the event code to a tag, and log the event */
    log_event(vmg_ evt_to_tag(evt), param, paramlen, param_is_utf8);

    /* return the event type code */
    return evt;
}